

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O0

uchar __thiscall xercesc_4_0::XPathMatcher::isMatched(XPathMatcher *this)

{
  ulong local_20;
  XMLSize_t i;
  XPathMatcher *this_local;
  
  local_20 = 0;
  while( true ) {
    if (this->fLocationPathSize <= local_20) {
      return '\0';
    }
    if (((this->fMatched[local_20] & 1) == 1) && ((this->fMatched[local_20] & 0xd) != 0xd)) break;
    local_20 = local_20 + 1;
  }
  return this->fMatched[local_20];
}

Assistant:

unsigned char XPathMatcher::isMatched() {

    // xpath has been matched if any one of the members of the union have matched.
    for (XMLSize_t i=0; i < fLocationPathSize; i++) {
        if (((fMatched[i] & XP_MATCHED) == XP_MATCHED)
            && ((fMatched[i] & XP_MATCHED_DP) != XP_MATCHED_DP))
            return fMatched[i];
    }

    return 0;
}